

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagator.h
# Opt level: O1

bool __thiscall spvtools::opt::Edge::operator<(Edge *this,Edge *o)

{
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> _Var1;
  Instruction *pIVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  
  _Var1._M_head_impl =
       (this->source->label_)._M_t.
       super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
       ._M_t.
       super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
       .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  uVar4 = 0;
  uVar3 = 0;
  if ((_Var1._M_head_impl)->has_result_id_ == true) {
    uVar3 = Instruction::GetSingleWordOperand
                      (_Var1._M_head_impl,(uint)(_Var1._M_head_impl)->has_type_id_);
  }
  pIVar2 = (this->dest->label_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  if (pIVar2->has_result_id_ == true) {
    uVar4 = Instruction::GetSingleWordOperand(pIVar2,(uint)pIVar2->has_type_id_);
  }
  _Var1._M_head_impl =
       (o->source->label_)._M_t.
       super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
       ._M_t.
       super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
       .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  uVar6 = 0;
  uVar5 = 0;
  if ((_Var1._M_head_impl)->has_result_id_ == true) {
    uVar5 = Instruction::GetSingleWordOperand
                      (_Var1._M_head_impl,(uint)(_Var1._M_head_impl)->has_type_id_);
  }
  pIVar2 = (o->dest->label_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  if (pIVar2->has_result_id_ == true) {
    uVar6 = Instruction::GetSingleWordOperand(pIVar2,(uint)pIVar2->has_type_id_);
  }
  return uVar3 < uVar5 || uVar4 < uVar6 && uVar3 <= uVar5;
}

Assistant:

bool operator<(const Edge& o) const {
    return std::make_pair(source->id(), dest->id()) <
           std::make_pair(o.source->id(), o.dest->id());
  }